

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# work_mgga_inc.c
# Opt level: O1

void work_mgga_fxc_pol(xc_func_type *p,size_t np,double *rho,double *sigma,double *lapl,double *tau,
                      xc_mgga_out_params *out)

{
  double dVar1;
  double dVar2;
  int iVar3;
  uint uVar4;
  double *pdVar5;
  double *pdVar6;
  bool bVar7;
  bool bVar8;
  undefined1 auVar9 [16];
  uint uVar10;
  long lVar11;
  long lVar12;
  size_t sVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  double dVar20;
  double dVar21;
  double __x;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  double dVar54;
  double dVar55;
  double dVar56;
  double dVar57;
  double dVar58;
  double dVar59;
  double dVar60;
  double dVar61;
  double dVar62;
  double dVar63;
  double dVar64;
  double dVar65;
  double dVar66;
  double dVar67;
  double dVar68;
  undefined1 auVar69 [16];
  double dVar71;
  undefined1 auVar70 [16];
  double dVar72;
  double dVar73;
  double dVar74;
  double dVar75;
  double dVar76;
  double dVar77;
  double dVar78;
  double dVar79;
  double dVar80;
  double dVar81;
  double dVar82;
  double dVar83;
  double dVar84;
  double dVar85;
  double dVar86;
  double dVar87;
  double dVar88;
  double dVar89;
  double dVar90;
  double dVar91;
  double dVar92;
  double dVar93;
  double dVar94;
  double dVar95;
  double dVar96;
  double dVar97;
  double dVar98;
  double dVar99;
  double dVar100;
  double dVar101;
  double dVar102;
  double dVar103;
  double dVar104;
  double dVar105;
  double dVar106;
  double dVar107;
  double dVar108;
  double dVar109;
  double dVar110;
  double dVar111;
  double dVar112;
  double dVar113;
  double dVar114;
  double dVar115;
  double dVar116;
  double dVar117;
  double dVar118;
  double dVar119;
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  double dVar123;
  double dVar124;
  double dVar125;
  double dVar126;
  double dVar127;
  double dVar128;
  double dVar129;
  double dVar130;
  double dVar131;
  double dVar132;
  double dVar133;
  double dVar134;
  double dVar135;
  double dVar136;
  double dVar138;
  undefined1 auVar137 [16];
  double dVar139;
  double dVar140;
  double dVar141;
  double dVar142;
  double dVar143;
  double dVar144;
  double dVar145;
  double dVar146;
  double dVar147;
  double dVar148;
  double dVar149;
  double dVar150;
  double dVar151;
  double dVar152;
  double dVar153;
  double dVar154;
  double dVar155;
  double dVar156;
  double dVar157;
  double dVar158;
  double dVar159;
  double dVar160;
  double dVar161;
  double dVar162;
  double dVar163;
  undefined1 auVar164 [16];
  double dVar165;
  double dVar166;
  double dVar167;
  double dVar168;
  double dVar169;
  double dVar170;
  double dVar171;
  double dVar172;
  double dVar173;
  double dVar174;
  double dVar175;
  double dVar176;
  double dVar177;
  double dVar178;
  double dVar179;
  double dVar180;
  double dVar181;
  double dVar182;
  double dVar183;
  double dVar184;
  double dVar185;
  double dVar186;
  double dVar187;
  double dVar188;
  double dVar189;
  double dVar190;
  double dVar191;
  double dVar192;
  double dVar193;
  double dVar194;
  double dVar195;
  double dVar196;
  double dVar197;
  double dVar198;
  double dVar199;
  double dVar200;
  double dVar201;
  double dVar202;
  double dVar203;
  double dVar204;
  double dVar205;
  double dVar206;
  double dVar207;
  double dVar208;
  double dVar209;
  double dVar210;
  double dVar211;
  double dVar212;
  double dVar213;
  double __x_00;
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  double dVar216;
  double dVar217;
  double dVar218;
  double dVar219;
  double dVar220;
  double dVar221;
  double dVar222;
  double dVar223;
  double dVar224;
  double dVar225;
  double dVar226;
  double dVar227;
  double dVar228;
  double dVar229;
  double dVar230;
  double dVar231;
  double dVar232;
  double dVar233;
  double dVar234;
  double dVar235;
  double dVar236;
  double dVar237;
  double dVar238;
  double dVar239;
  double dVar240;
  double dVar241;
  double dVar242;
  double dVar243;
  double dVar244;
  double dVar245;
  undefined1 auVar246 [16];
  double local_1010;
  double local_fc0;
  undefined4 local_e78;
  undefined8 local_e38;
  double local_e08;
  double local_dd8;
  double local_af8;
  double local_aa8;
  undefined8 local_9e8;
  double local_798;
  double local_688;
  
  if (np != 0) {
    iVar3 = p->nspin;
    sVar13 = 0;
    dVar123 = 0.0;
    dVar163 = 0.0;
    local_1010 = 0.0;
    __x_00 = 0.0;
    do {
      if (iVar3 == 2) {
        lVar11 = (long)(p->dim).rho * sVar13;
        dVar20 = rho[lVar11] + rho[lVar11 + 1];
      }
      else {
        dVar20 = rho[(long)(p->dim).rho * sVar13];
      }
      dVar68 = p->dens_threshold;
      if (dVar68 <= dVar20) {
        lVar11 = (long)(p->dim).rho * sVar13;
        dVar20 = rho[lVar11];
        if (rho[lVar11] <= dVar68) {
          dVar20 = dVar68;
        }
        dVar21 = p->sigma_threshold * p->sigma_threshold;
        lVar12 = (long)(p->dim).sigma * sVar13;
        local_fc0 = sigma[lVar12];
        if (sigma[lVar12] <= dVar21) {
          local_fc0 = dVar21;
        }
        uVar4 = p->info->flags;
        if ((uVar4 >> 0x10 & 1) != 0) {
          dVar163 = tau[(long)(p->dim).tau * sVar13];
          if (tau[(long)(p->dim).tau * sVar13] <= p->tau_threshold) {
            dVar163 = p->tau_threshold;
          }
          if (((uVar4 >> 0x11 & 1) != 0) && (dVar72 = dVar20 * 8.0 * dVar163, dVar72 <= local_fc0))
          {
            local_fc0 = dVar72;
          }
        }
        if (iVar3 == 2) {
          __x_00 = rho[lVar11 + 1];
          if (rho[lVar11 + 1] <= dVar68) {
            __x_00 = dVar68;
          }
          local_1010 = sigma[lVar12 + 2];
          if (sigma[lVar12 + 2] <= dVar21) {
            local_1010 = dVar21;
          }
          if ((uVar4 >> 0x10 & 1) != 0) {
            dVar123 = tau[(long)(p->dim).tau * sVar13 + 1];
            if (tau[(long)(p->dim).tau * sVar13 + 1] <= p->tau_threshold) {
              dVar123 = p->tau_threshold;
            }
            if (((uVar4 >> 0x11 & 1) != 0) &&
               (dVar21 = __x_00 * 8.0 * dVar123, dVar21 <= local_1010)) {
              local_1010 = dVar21;
            }
          }
        }
        __x = dVar20 + __x_00;
        dVar124 = 1.0 / __x;
        dVar99 = (dVar20 + dVar20) * dVar124;
        dVar21 = p->zeta_threshold;
        dVar100 = dVar21 + -1.0;
        dVar139 = (__x_00 + __x_00) * dVar124;
        dVar125 = dVar20 - __x_00;
        uVar14 = -(ulong)(dVar139 <= dVar21);
        dVar72 = dVar100;
        if (dVar21 < dVar99) {
          dVar72 = (double)(~uVar14 & (ulong)(dVar125 * dVar124) | uVar14 & (ulong)-dVar100);
        }
        pdVar5 = (double *)p->params;
        dVar72 = dVar72 + 1.0;
        dVar22 = cbrt(dVar21);
        dVar23 = cbrt(dVar72);
        dVar24 = cbrt(__x);
        dVar73 = pdVar5[0xc] * dVar24;
        dVar25 = cbrt(9.869604401089358);
        dVar26 = cbrt(dVar20);
        uVar15 = -(ulong)(dVar72 <= dVar21);
        dVar129 = (double)(uVar15 & (ulong)(dVar22 * dVar21) | ~uVar15 & (ulong)(dVar23 * dVar72));
        dVar167 = 1.0 / (dVar25 * dVar25);
        dVar101 = 1.0 / (dVar26 * dVar26);
        dVar74 = dVar25 * dVar25 * 0.9905781746683879;
        dVar102 = dVar101 / dVar20;
        dVar187 = dVar74 + dVar163 * dVar102;
        dVar75 = dVar187 * dVar187;
        dVar27 = dVar187 * dVar75;
        dVar196 = dVar75 * dVar75;
        dVar126 = 1.0 / (dVar196 * dVar27);
        auVar164._0_8_ = dVar75 * dVar196;
        auVar164._8_8_ = dVar196 * dVar196;
        auVar164 = divpd(_DAT_01041040,auVar164);
        dVar186 = auVar164._8_8_;
        dVar103 = dVar186 / dVar75;
        auVar215._8_8_ = dVar186;
        auVar215._0_8_ = 0x3ff0000000000000;
        auVar120._8_8_ = dVar187;
        auVar120._0_8_ = dVar75;
        auVar120 = divpd(auVar215,auVar120);
        dVar76 = 1.0 / dVar27;
        dVar27 = dVar186 / dVar27;
        dVar77 = dVar129 * 0.9847450218426964;
        dVar168 = dVar167 * 1.8171205928321397;
        dVar75 = dVar20 * dVar20;
        dVar28 = 1.0 / dVar187;
        dVar29 = 1.0 / dVar196;
        dVar30 = 1.0 / (dVar187 * dVar196);
        dVar193 = auVar120._8_8_;
        dVar31 = dVar77 * -0.375;
        local_dd8 = -dVar125;
        uVar16 = -(ulong)(dVar99 <= dVar21);
        if (dVar21 < dVar139) {
          dVar100 = (double)(~uVar16 & (ulong)(dVar124 * local_dd8) | (ulong)-dVar100 & uVar16);
        }
        dVar40 = *pdVar5;
        dVar1 = pdVar5[1];
        dVar2 = pdVar5[2];
        dVar65 = pdVar5[3];
        dVar61 = pdVar5[6];
        dVar62 = pdVar5[7];
        dVar63 = pdVar5[8];
        dVar64 = pdVar5[9];
        dVar67 = pdVar5[10];
        dVar60 = pdVar5[0xb];
        dVar100 = dVar100 + 1.0;
        dVar32 = cbrt(dVar100);
        uVar17 = -(ulong)(dVar100 <= dVar21);
        dVar157 = (double)((ulong)(dVar22 * dVar21) & uVar17 | ~uVar17 & (ulong)(dVar100 * dVar32));
        dVar33 = dVar157 * 0.9847450218426964;
        dVar78 = __x_00 * __x_00;
        dVar34 = cbrt(__x_00);
        dVar79 = 1.0 / (dVar34 * dVar34);
        dVar35 = dVar79 / dVar78;
        dVar140 = dVar168 * 0.009146457198521547 * local_1010 * dVar35 + 0.804;
        dVar169 = 1.804 - 0.646416 / dVar140;
        dVar80 = dVar79 / __x_00;
        dVar238 = dVar74 - dVar123 * dVar80;
        auVar69._0_8_ = dVar123 * dVar80 + dVar74;
        dVar74 = dVar74 - dVar163 * dVar102;
        dVar230 = dVar74 * dVar74;
        dVar216 = dVar230 * dVar230;
        dVar221 = dVar74 * dVar230;
        dVar197 = dVar216 * dVar216;
        dVar202 = dVar197 * dVar63;
        dVar170 = dVar74 * dVar197;
        dVar81 = dVar101 / dVar75;
        dVar179 = local_fc0 * dVar168 * 0.009146457198521547 * dVar81 + 0.804;
        dVar141 = 1.804 - 0.646416 / dVar179;
        dVar171 = dVar170 * dVar64;
        dVar82 = dVar230 * dVar197 * dVar67;
        dVar104 = dVar197 * dVar60 * dVar221;
        dVar83 = dVar1 * dVar74;
        dVar105 = dVar2 * dVar230;
        local_aa8 = auVar120._0_8_;
        dVar84 = dVar65 * dVar221;
        dVar22 = pdVar5[4];
        dVar66 = pdVar5[5];
        dVar106 = dVar22 * dVar216;
        dVar149 = dVar74 * dVar216;
        dVar165 = dVar216 * dVar221;
        dVar127 = dVar66 * dVar149;
        dVar138 = dVar62 * dVar165;
        dVar107 = dVar230 * dVar216;
        dVar108 = dVar107 * dVar61;
        local_af8 = auVar164._0_8_;
        dVar85 = dVar138 * dVar126 +
                 dVar108 * local_af8 +
                 dVar127 * dVar30 +
                 dVar106 * dVar29 +
                 dVar84 * dVar76 +
                 dVar105 * local_aa8 +
                 dVar83 * dVar28 +
                 dVar104 * dVar27 + dVar82 * dVar103 + dVar202 * dVar186 + dVar193 * dVar171 +
                 dVar40;
        dVar142 = dVar141 * dVar85;
        dVar86 = dVar73 * dVar142;
        uVar18 = -(ulong)(dVar20 <= dVar68);
        auVar121._0_8_ = auVar69._0_8_ * auVar69._0_8_;
        dVar128 = auVar121._0_8_ * auVar121._0_8_;
        dVar222 = 1.0 / (dVar128 * dVar128);
        dVar98 = auVar121._0_8_ * auVar69._0_8_;
        dVar172 = 1.0 / dVar98;
        dVar198 = 1.0 / (dVar98 * dVar128);
        dVar243 = 1.0 / auVar69._0_8_;
        auVar69._8_8_ = dVar128;
        auVar214._8_8_ = 0x3ff0000000000000;
        auVar214._0_8_ = dVar222;
        auVar215 = divpd(auVar214,auVar69);
        dVar231 = 1.0 / auVar121._0_8_;
        auVar121._8_8_ = auVar121._0_8_ * dVar128;
        auVar137._8_8_ = 0x3ff0000000000000;
        auVar137._0_8_ = dVar222;
        auVar120 = divpd(auVar137,auVar121);
        dVar188 = dVar1 * dVar238;
        dVar217 = dVar238 * dVar238;
        dVar36 = dVar2 * dVar217;
        dVar189 = dVar238 * dVar217;
        dVar37 = dVar65 * dVar189;
        dVar232 = dVar217 * dVar217;
        dVar109 = dVar238 * dVar232;
        dVar173 = dVar232 * dVar22;
        dVar178 = dVar109 * dVar66;
        dVar97 = auVar215._0_8_;
        auVar246._8_8_ = dVar222;
        auVar246._0_8_ = 0x3ff0000000000000;
        auVar9._8_8_ = dVar98;
        auVar9._0_8_ = dVar128 * auVar69._0_8_;
        auVar164 = divpd(auVar246,auVar9);
        dVar227 = auVar164._0_8_;
        dVar87 = dVar232 * dVar232;
        dVar110 = dVar217 * dVar232;
        dVar150 = dVar61 * dVar110;
        dVar166 = dVar67 * dVar217 * dVar87;
        dVar194 = auVar120._0_8_;
        dVar195 = auVar120._8_8_;
        dVar233 = dVar232 * dVar189;
        dVar98 = dVar62 * dVar233;
        dVar111 = dVar63 * dVar87;
        dVar239 = dVar238 * dVar87;
        dVar38 = dVar64 * dVar239;
        dVar39 = dVar60 * dVar87 * dVar189;
        dVar229 = auVar164._8_8_;
        dVar40 = dVar39 * dVar229 +
                 dVar166 * dVar194 +
                 dVar38 * dVar97 +
                 dVar111 * dVar222 +
                 dVar98 * dVar198 +
                 dVar150 * dVar195 +
                 dVar178 * dVar227 +
                 dVar173 * auVar215._8_8_ + dVar37 * dVar172 + dVar188 * dVar243 + dVar36 * dVar231
                 + dVar40;
        dVar180 = dVar169 * dVar40;
        dVar151 = dVar73 * dVar180;
        local_e78 = SUB84(dVar61,0);
        dVar41 = dVar33 * -0.375;
        local_9e8 = (double)CONCAT44(auVar215._12_4_,local_e78);
        uVar19 = -(ulong)(__x_00 <= dVar68);
        dVar218 = (double)(~uVar19 & (ulong)(dVar41 * dVar151)) +
                  (double)(~uVar18 & (ulong)(dVar31 * dVar86));
        local_e38 = (double)CONCAT44((int)((ulong)dVar23 >> 0x20),local_e78);
        pdVar6 = out->zk;
        if ((uVar4 & 1) != 0 && pdVar6 != (double *)0x0) {
          lVar11 = (long)(p->dim).zk * sVar13;
          pdVar6[lVar11] = pdVar6[lVar11] + dVar218;
        }
        dVar23 = 1.0 / (__x * __x);
        bVar7 = dVar21 < dVar139;
        bVar8 = dVar21 < dVar99;
        dVar42 = 0.0;
        local_688 = 0.0;
        if (bVar8 && bVar7) {
          dVar42 = dVar124 - dVar125 * dVar23;
        }
        dVar88 = local_e38 * 1.3333333333333333;
        dVar43 = (double)(~uVar15 & (ulong)(dVar88 * dVar42));
        dVar112 = 1.0 / (dVar24 * dVar24);
        dVar24 = 1.0 / (dVar179 * dVar179);
        dVar181 = dVar81 * dVar163 * dVar126;
        dVar143 = dVar107 * dVar62;
        dVar219 = dVar81 * dVar163 * dVar186;
        dVar234 = dVar186 / dVar196;
        dVar199 = dVar197 * dVar64;
        dVar44 = dVar170 * dVar67;
        dVar113 = dVar163 * local_aa8;
        dVar223 = dVar2 * dVar74;
        dVar152 = dVar81 * dVar163 * dVar76;
        dVar45 = dVar65 * dVar230;
        dVar182 = dVar81 * dVar163 * dVar29;
        dVar46 = dVar22 * dVar221;
        dVar200 = dVar81 * dVar163 * dVar30;
        dVar47 = dVar66 * dVar216;
        dVar153 = dVar81 * dVar163 * local_af8;
        dVar48 = dVar61 * dVar149;
        dVar71 = dVar63 * dVar165;
        dVar89 = dVar81 * dVar163 * dVar193;
        dVar90 = dVar81 * dVar163 * dVar103;
        dVar91 = dVar81 * dVar163 * dVar27;
        dVar49 = dVar230 * dVar197 * dVar60;
        dVar144 = dVar163 * dVar234 * dVar104 * 18.333333333333332 * dVar81 +
                  dVar91 * dVar49 * 18.333333333333332 +
                  dVar82 * 16.666666666666668 * dVar91 +
                  dVar44 * 16.666666666666668 * dVar90 +
                  dVar171 * 15.0 * dVar90 +
                  dVar199 * 15.0 * dVar89 +
                  dVar202 * 13.333333333333334 * dVar89 +
                  dVar71 * 13.333333333333334 * dVar219 +
                  dVar138 * 11.666666666666666 * dVar219 +
                  dVar181 * dVar108 * 10.0 + dVar143 * 11.666666666666666 * dVar181 +
                  dVar153 * dVar48 * 10.0 +
                  dVar127 * 8.333333333333334 * dVar153 +
                  dVar200 * dVar47 * 8.333333333333334 +
                  dVar106 * 6.666666666666667 * dVar200 +
                  dVar182 * dVar46 * 6.666666666666667 +
                  dVar84 * 5.0 * dVar182 +
                  dVar152 * dVar45 * 5.0 +
                  dVar105 * 3.3333333333333335 * dVar152 +
                  dVar81 * dVar113 * dVar223 * 3.3333333333333335 +
                  dVar163 * dVar1 * 1.6666666666666667 * dVar81 * dVar28 +
                  dVar83 * 1.6666666666666667 * dVar81 * dVar113;
        dVar152 = dVar43 * 0.9847450218426964;
        dVar203 = pdVar5[0xc] * dVar112;
        dVar153 = dVar142 * dVar203;
        dVar174 = dVar77 * dVar153 * 0.125;
        dVar129 = dVar129 * 1.4422495703074083;
        dVar181 = dVar73 * dVar24;
        dVar219 = dVar129 * dVar181;
        dVar89 = dVar20 * dVar75;
        dVar182 = dVar101 / dVar89;
        dVar90 = local_fc0 * dVar182 * dVar168;
        dVar91 = dVar90 * dVar85;
        dVar200 = dVar73 * dVar141 * dVar144;
        if (dVar68 < dVar20) {
          local_688 = dVar31 * dVar200 +
                      dVar219 * 0.0040369036088841095 * dVar91 +
                      (dVar152 * -0.375 * dVar86 - dVar174);
        }
        dVar114 = 0.0;
        if (dVar21 < dVar139) {
          dVar114 = (double)(~uVar16 & (ulong)(-dVar124 - dVar23 * local_dd8));
        }
        dVar175 = dVar32 * 1.3333333333333333;
        dVar139 = (double)(~uVar17 & (ulong)(dVar175 * dVar114));
        dVar183 = dVar139 * 0.9847450218426964;
        dVar50 = dVar180 * dVar203;
        dVar184 = dVar183 * -0.375;
        dVar145 = dVar33 * dVar50 * -0.125;
        dVar146 = (double)(~uVar19 & (ulong)(dVar184 * dVar151 + dVar145));
        pdVar6 = out->vrho;
        if ((uVar4 & 2) != 0 && pdVar6 != (double *)0x0) {
          lVar11 = (long)(p->dim).vrho * sVar13;
          pdVar6[lVar11] = __x * (local_688 + dVar146) + dVar218 + pdVar6[lVar11];
        }
        local_798 = 0.0;
        dVar147 = 0.0;
        if (dVar21 < dVar99) {
          dVar147 = (double)(~uVar14 & (ulong)(-dVar124 - dVar125 * dVar23));
        }
        dVar99 = 0.0;
        if (bVar8 && bVar7) {
          dVar99 = dVar124 - dVar23 * local_dd8;
        }
        dVar190 = (double)(~uVar15 & (ulong)(dVar88 * dVar147));
        dVar204 = (double)(~uVar17 & (ulong)(dVar99 * dVar175));
        dVar148 = 1.0 / (dVar140 * dVar140);
        dVar124 = dVar123 * dVar231;
        dVar51 = dVar2 * dVar238;
        dVar115 = dVar35 * dVar123 * dVar172;
        dVar224 = dVar233 * dVar63;
        dVar228 = dVar217 * dVar65;
        dVar240 = dVar66 * dVar232;
        dVar242 = dVar64 * dVar87;
        dVar154 = dVar35 * dVar123 * local_9e8;
        dVar52 = dVar22 * dVar189;
        dVar176 = dVar35 * dVar123 * dVar227;
        dVar116 = dVar35 * dVar123 * dVar195;
        dVar53 = dVar61 * dVar109;
        dVar244 = dVar222 / dVar128;
        dVar130 = dVar35 * dVar123 * dVar198;
        dVar235 = dVar62 * dVar110;
        dVar237 = dVar60 * dVar217 * dVar87;
        dVar155 = dVar35 * dVar123 * dVar222;
        dVar131 = dVar35 * dVar123 * dVar97;
        dVar156 = dVar35 * dVar123 * dVar194;
        dVar54 = dVar67 * dVar239;
        dVar132 = dVar35 * dVar123 * dVar229;
        dVar154 = dVar39 * 18.333333333333332 * dVar123 * dVar244 * dVar35 +
                  dVar132 * dVar237 * 18.333333333333332 +
                  dVar166 * 16.666666666666668 * dVar132 +
                  dVar156 * dVar54 * 16.666666666666668 +
                  dVar38 * 15.0 * dVar156 +
                  dVar131 * dVar242 * 15.0 +
                  dVar111 * 13.333333333333334 * dVar131 +
                  dVar155 * dVar224 * 13.333333333333334 +
                  dVar98 * 11.666666666666666 * dVar155 +
                  dVar130 * dVar150 * 10.0 + dVar235 * 11.666666666666666 * dVar130 +
                  dVar116 * dVar53 * 10.0 +
                  dVar178 * 8.333333333333334 * dVar116 +
                  dVar176 * dVar240 * 8.333333333333334 +
                  dVar173 * 6.666666666666667 * dVar176 +
                  dVar154 * dVar52 * 6.666666666666667 +
                  dVar37 * 5.0 * dVar154 +
                  dVar115 * dVar228 * 5.0 +
                  dVar36 * 3.3333333333333335 * dVar115 +
                  dVar35 * dVar124 * dVar51 * 3.3333333333333335 +
                  dVar123 * dVar1 * 1.6666666666666667 * dVar35 * dVar243 +
                  dVar188 * 1.6666666666666667 * dVar35 * dVar124;
        dVar132 = dVar190 * 0.9847450218426964;
        dVar201 = dVar132 * -0.375;
        dVar205 = dVar204 * 0.9847450218426964;
        dVar157 = dVar157 * 1.4422495703074083;
        dVar155 = dVar73 * dVar148;
        dVar115 = dVar157 * dVar155;
        dVar116 = __x_00 * dVar78;
        dVar156 = dVar79 / dVar116;
        dVar130 = local_1010 * dVar156 * dVar168;
        dVar176 = dVar130 * dVar40;
        dVar131 = dVar73 * dVar169 * dVar154;
        if (dVar68 < __x_00) {
          local_798 = dVar41 * dVar131 +
                      dVar115 * 0.0040369036088841095 * dVar176 +
                      dVar205 * -0.375 * dVar151 + dVar145;
        }
        dVar174 = (double)(~uVar18 & (ulong)(dVar201 * dVar86 - dVar174));
        if ((uVar4 & 2) != 0 && pdVar6 != (double *)0x0) {
          lVar11 = (long)(p->dim).vrho * sVar13;
          pdVar6[lVar11 + 1] = (dVar174 + local_798) * __x + dVar218 + pdVar6[lVar11 + 1];
        }
        dVar92 = dVar73 * dVar129;
        dVar218 = dVar167 * dVar81 * dVar24 * 1.8171205928321397;
        dVar145 = dVar218 * dVar85;
        dVar93 = dVar92 * -0.0015138388533315413;
        dVar117 = (double)(~uVar18 & (ulong)(dVar93 * dVar145));
        pdVar6 = out->vsigma;
        if ((uVar4 & 2) != 0 && pdVar6 != (double *)0x0) {
          lVar11 = (long)(p->dim).vsigma * sVar13;
          pdVar6[lVar11] = __x * dVar117 + pdVar6[lVar11];
          lVar11 = (long)(p->dim).vsigma * sVar13;
          pdVar6[lVar11 + 1] = pdVar6[lVar11 + 1] + 0.0;
        }
        dVar94 = dVar73 * dVar157;
        dVar55 = dVar167 * dVar35 * dVar148 * 1.8171205928321397;
        dVar56 = dVar55 * dVar40;
        dVar95 = dVar94 * -0.0015138388533315413;
        dVar57 = (double)(~uVar19 & (ulong)(dVar95 * dVar56));
        if ((uVar4 & 2) != 0 && pdVar6 != (double *)0x0) {
          lVar11 = (long)(p->dim).vsigma * sVar13;
          pdVar6[lVar11 + 2] = __x * dVar57 + pdVar6[lVar11 + 2];
        }
        pdVar6 = out->vlapl;
        uVar10 = ~uVar4;
        if ((uVar10 & 0x8002) == 0 && pdVar6 != (double *)0x0) {
          lVar11 = (long)(p->dim).vlapl * sVar13;
          pdVar6[lVar11] = pdVar6[lVar11] + 0.0;
          lVar11 = (long)(p->dim).vlapl * sVar13;
          pdVar6[lVar11 + 1] = pdVar6[lVar11 + 1] + 0.0;
        }
        dVar133 = dVar202 * -8.0 * dVar102 * dVar193 +
                  dVar138 * -7.0 * dVar102 * dVar186 +
                  dVar108 * -6.0 * dVar102 * dVar126 +
                  dVar49 * -11.0 * dVar102 * dVar27 +
                  dVar44 * -10.0 * dVar102 * dVar103 +
                  dVar199 * -9.0 * dVar102 * dVar193 +
                  dVar71 * -8.0 * dVar102 * dVar186 +
                  dVar143 * -7.0 * dVar102 * dVar126 +
                  dVar82 * -10.0 * dVar102 * dVar27 +
                  dVar104 * -11.0 * dVar234 * dVar102 + dVar171 * -9.0 * dVar102 * dVar103 +
                  dVar127 * -5.0 * dVar102 * local_af8 +
                  dVar106 * -4.0 * dVar102 * dVar30 +
                  dVar84 * -3.0 * dVar102 * dVar29 +
                  dVar105 * -2.0 * dVar102 * dVar76 +
                  ((dVar48 * -6.0 * dVar102 * local_af8 +
                   dVar47 * -5.0 * dVar102 * dVar30 +
                   dVar46 * -4.0 * dVar102 * dVar29 +
                   dVar45 * -3.0 * dVar102 * dVar76 +
                   (dVar223 * -2.0 * dVar102 * local_aa8 - dVar102 * dVar1 * dVar28)) -
                  dVar102 * local_aa8 * dVar83);
        dVar102 = dVar73 * dVar141 * dVar133;
        dVar118 = (double)(~uVar18 & (ulong)(dVar31 * dVar102));
        pdVar6 = out->vtau;
        if ((uVar10 & 0x10002) == 0 && pdVar6 != (double *)0x0) {
          lVar11 = (long)(p->dim).vtau * sVar13;
          pdVar6[lVar11] = __x * dVar118 + pdVar6[lVar11];
        }
        dVar80 = dVar237 * -11.0 * dVar80 * dVar229 +
                 dVar54 * -10.0 * dVar80 * dVar194 +
                 dVar242 * -9.0 * dVar80 * dVar97 +
                 dVar224 * -8.0 * dVar80 * dVar222 +
                 dVar235 * -7.0 * dVar80 * dVar198 +
                 dVar166 * -10.0 * dVar80 * dVar229 +
                 dVar38 * -9.0 * dVar80 * dVar194 +
                 dVar111 * -8.0 * dVar80 * dVar97 +
                 dVar98 * -7.0 * dVar80 * dVar222 +
                 dVar39 * -11.0 * dVar244 * dVar80 + dVar150 * -6.0 * dVar80 * dVar198 +
                 dVar53 * -6.0 * dVar80 * dVar195 +
                 dVar240 * -5.0 * dVar80 * dVar227 +
                 dVar52 * -4.0 * dVar80 * local_9e8 +
                 dVar228 * -3.0 * dVar80 * dVar172 +
                 dVar51 * -2.0 * dVar80 * dVar231 +
                 dVar178 * -5.0 * dVar80 * dVar195 +
                 dVar173 * -4.0 * dVar80 * dVar227 +
                 dVar37 * -3.0 * dVar80 * local_9e8 +
                 dVar36 * -2.0 * dVar80 * dVar172 +
                 (-dVar1 * dVar80 * dVar243 - dVar80 * dVar231 * dVar188);
        dVar58 = dVar73 * dVar169 * dVar80;
        dVar59 = (double)(~uVar19 & (ulong)(dVar41 * dVar58));
        if ((uVar10 & 0x10002) == 0 && pdVar6 != (double *)0x0) {
          lVar11 = (long)(p->dim).vtau * sVar13;
          pdVar6[lVar11 + 1] = __x * dVar59 + pdVar6[lVar11 + 1];
        }
        dVar96 = 1.0 / (local_e38 * local_e38);
        dVar158 = 1.0 / (__x * __x * __x);
        dVar125 = dVar125 * dVar158;
        dVar125 = dVar125 + dVar125;
        dVar177 = -0.0;
        if (dVar21 < dVar72) {
          dVar177 = 0.0;
          if (bVar8 && bVar7) {
            dVar177 = dVar125 - (dVar23 + dVar23);
          }
          dVar177 = (dVar177 * dVar88 + dVar96 * 0.4444444444444444 * dVar42 * dVar42) *
                    0.9847450218426964 * -0.375;
        }
        dVar43 = dVar43 * 1.4422495703074083;
        dVar191 = (dVar112 / __x) * pdVar5[0xc];
        dVar142 = (dVar142 * dVar191 * dVar77) / 12.0;
        dVar185 = dVar24 * dVar203 * dVar129 * dVar91;
        dVar225 = dVar73 * (dVar24 / dVar179) * dVar129;
        dVar25 = (1.0 / dVar25) / 9.869604401089358;
        dVar112 = dVar25 * 3.3019272488946267;
        dVar134 = 1.0 / (dVar32 * dVar32);
        dVar158 = dVar158 * local_dd8;
        dVar158 = dVar158 + dVar158;
        dVar32 = -0.0;
        if (dVar21 < dVar100) {
          dVar32 = 0.0;
          if (bVar8 && bVar7) {
            dVar32 = dVar23 + dVar23 + dVar158;
          }
          dVar32 = (dVar32 * dVar175 + dVar134 * 0.4444444444444444 * dVar114 * dVar114) *
                   0.9847450218426964 * -0.375;
        }
        dVar159 = dVar75 * dVar75;
        dVar26 = 1.0 / dVar26;
        dVar135 = dVar26 / (dVar20 * dVar159);
        dVar187 = dVar186 / (dVar187 * dVar196);
        dVar196 = dVar141 * dVar144 * dVar203 * dVar77;
        dVar74 = dVar74 * dVar65;
        dVar230 = dVar230 * dVar22;
        dVar221 = dVar221 * dVar66;
        dVar216 = dVar216 * dVar61;
        dVar197 = dVar197 * dVar67;
        dVar170 = dVar170 * dVar60;
        dVar107 = dVar107 * dVar63;
        dVar165 = dVar165 * dVar64;
        dVar149 = dVar149 * dVar62;
        dVar183 = dVar183 * dVar50;
        dVar180 = (dVar180 * dVar191 * dVar33) / 12.0;
        pdVar5 = out->v2rho2;
        if ((uVar4 & 4) != 0 && pdVar5 != (double *)0x0) {
          dVar119 = dVar163 * dVar163;
          dVar160 = dVar163 * dVar76 * dVar182;
          dVar161 = dVar163 * dVar29 * dVar182;
          dVar206 = dVar163 * dVar27 * dVar182;
          dVar207 = dVar163 * dVar30 * dVar182;
          dVar208 = dVar163 * local_af8 * dVar182;
          dVar209 = dVar163 * dVar126 * dVar182;
          dVar210 = dVar163 * dVar186 * dVar182;
          dVar211 = dVar163 * dVar193 * dVar182;
          dVar212 = dVar163 * dVar103 * dVar182;
          dVar192 = dVar119 * dVar76 * dVar135;
          dVar241 = dVar119 * dVar29 * dVar135;
          dVar236 = dVar119 * dVar30 * dVar135;
          dVar245 = dVar119 * local_af8 * dVar135;
          dVar162 = dVar119 * dVar126 * dVar135;
          dVar191 = dVar119 * dVar186 * dVar135;
          dVar220 = dVar119 * dVar103 * dVar135;
          dVar213 = dVar119 * dVar27 * dVar135;
          dVar226 = dVar119 * dVar234 * dVar135;
          dVar136 = dVar119 * dVar193 * dVar135;
          lVar11 = (long)(p->dim).v2rho2 * sVar13;
          pdVar5[lVar11] =
               ((double)(~uVar19 & (ulong)(dVar32 * dVar151 + dVar183 * -0.25 + dVar180)) +
               (double)(~uVar18 &
                       (ulong)((dVar138 * 155.55555555555554 * dVar136 +
                                dVar143 * 272.22222222222223 * dVar191 +
                                dVar149 * 116.66666666666667 * dVar162 +
                                dVar119 * dVar187 * dVar104 * 366.6666666666667 * dVar135 +
                                dVar165 * 200.0 * dVar136 +
                                dVar202 * 200.0 * dVar220 +
                                dVar71 * 355.55555555555554 * dVar136 +
                                dVar107 * 155.55555555555554 * dVar191 +
                                dVar105 * 16.666666666666668 * dVar241 +
                                dVar49 * 672.2222222222222 * dVar226 +
                                dVar170 * 305.55555555555554 * dVar213 +
                                dVar82 * 305.55555555555554 * dVar226 +
                                dVar197 * 250.0 * dVar220 + dVar44 * 555.5555555555555 * dVar213 +
                               dVar171 * 250.0 * dVar213 +
                               dVar199 * 450.0 * dVar220 +
                               dVar223 * 22.22222222222222 * dVar192 +
                               dVar83 * 5.555555555555555 * dVar192 +
                               dVar108 * 116.66666666666667 * dVar191 +
                               dVar48 * 200.0 * dVar162 +
                               dVar216 * 83.33333333333333 * dVar245 +
                               dVar127 * 83.33333333333333 * dVar162 +
                               dVar47 * 138.88888888888889 * dVar245 +
                               dVar221 * 55.55555555555556 * dVar236 +
                               dVar106 * 55.55555555555556 * dVar245 +
                               dVar230 * 33.333333333333336 * dVar241 +
                               dVar46 * 88.88888888888889 * dVar236 +
                               dVar84 * 33.333333333333336 * dVar236 +
                               dVar45 * 50.0 * dVar241 +
                               dVar74 * 16.666666666666668 * dVar192 +
                               dVar83 * -4.444444444444445 * dVar182 * dVar113 +
                               dVar44 * -44.44444444444444 * dVar212 +
                               dVar171 * -40.0 * dVar212 +
                               dVar199 * -40.0 * dVar211 +
                               dVar202 * -35.55555555555556 * dVar211 +
                               dVar71 * -35.55555555555556 * dVar210 +
                               dVar138 * -31.11111111111111 * dVar210 +
                               dVar143 * -31.11111111111111 * dVar209 +
                               dVar108 * -26.666666666666668 * dVar209 +
                               dVar127 * -22.22222222222222 * dVar208 +
                               dVar48 * -26.666666666666668 * dVar208 +
                               dVar47 * -22.22222222222222 * dVar207 +
                               dVar106 * -17.77777777777778 * dVar207 +
                               dVar46 * -17.77777777777778 * dVar161 +
                               dVar163 * dVar234 * dVar104 * -48.888888888888886 * dVar182 +
                               dVar49 * -48.888888888888886 * dVar206 +
                               dVar82 * -44.44444444444444 * dVar206 +
                               dVar84 * -13.333333333333334 * dVar161 +
                               dVar45 * -13.333333333333334 * dVar160 +
                               dVar105 * -8.88888888888889 * dVar160 +
                               dVar223 * -8.88888888888889 * dVar182 * dVar113 +
                               dVar163 * dVar1 * -4.444444444444445 * dVar182 * dVar28 +
                               dVar119 * dVar1 * 5.555555555555555 * dVar135 * local_aa8 +
                               dVar119 * dVar2 * 5.555555555555555 * dVar135 * local_aa8) * dVar141
                               * dVar73 * dVar31 +
                              dVar219 * 0.008073807217768219 * dVar90 * dVar144 +
                              dVar196 * -0.25 +
                              dVar185 * 0.0026912690725894063 +
                              dVar152 * -0.75 * dVar200 +
                              dVar43 * dVar181 * 0.008073807217768219 * dVar91 +
                              dVar177 * dVar86 + dVar152 * dVar153 * -0.25 + dVar142 +
                              dVar225 * 0.00019692461905715026 *
                              (dVar26 / (dVar159 * dVar89)) * local_fc0 * local_fc0 * dVar112 *
                              dVar85 + dVar219 * -0.014801979899241736 *
                                       (dVar101 / dVar159) * local_fc0 * dVar168 * dVar85))) * __x +
               local_688 + local_688 + dVar146 + dVar146 + pdVar5[lVar11];
        }
        dVar101 = -0.0;
        if (dVar21 < dVar72) {
          dVar101 = 0.0;
          if (bVar8 && bVar7) {
            dVar101 = dVar125;
          }
          dVar101 = (dVar96 * dVar147 * 0.4444444444444444 * dVar42 + dVar101 * dVar88) *
                    0.9847450218426964 * -0.375;
        }
        dVar132 = dVar153 * dVar132;
        dVar190 = dVar190 * 1.4422495703074083;
        dVar32 = 0.0;
        if (dVar68 < dVar20) {
          dVar32 = dVar196 * -0.125 +
                   dVar185 * 0.0013456345362947032 +
                   dVar152 * dVar153 * -0.125 +
                   dVar200 * dVar201 +
                   dVar181 * dVar190 * 0.0040369036088841095 * dVar91 +
                   dVar101 * dVar86 + dVar132 * -0.125 + dVar142;
        }
        dVar101 = -0.0;
        if (dVar21 < dVar100) {
          dVar101 = 0.0;
          if (bVar8 && bVar7) {
            dVar101 = dVar158;
          }
          dVar101 = (dVar99 * dVar134 * 0.4444444444444444 * dVar114 + dVar101 * dVar175) *
                    0.9847450218426964 * -0.375;
        }
        dVar139 = dVar139 * 1.4422495703074083;
        dVar42 = dVar148 * dVar203 * dVar157 * dVar176;
        dVar91 = dVar169 * dVar154 * dVar203 * dVar33;
        dVar196 = 0.0;
        if (dVar68 < __x_00) {
          dVar196 = dVar91 * -0.125 +
                    dVar184 * dVar131 +
                    dVar42 * 0.0013456345362947032 +
                    dVar155 * dVar139 * 0.0040369036088841095 * dVar176 +
                    dVar183 * -0.125 + dVar101 * dVar151 + dVar50 * dVar205 * -0.125 + dVar180;
        }
        if ((uVar4 & 4) != 0 && pdVar5 != (double *)0x0) {
          lVar11 = (long)(p->dim).v2rho2 * sVar13;
          pdVar5[lVar11 + 1] =
               (dVar32 + dVar196) * __x + local_688 + dVar146 + dVar174 + local_798 +
               pdVar5[lVar11 + 1];
        }
        dVar101 = -0.0;
        if (dVar21 < dVar72) {
          dVar72 = 0.0;
          if (bVar8 && bVar7) {
            dVar72 = dVar23 + dVar23 + dVar125;
          }
          dVar101 = (dVar88 * dVar72 + dVar96 * 0.4444444444444444 * dVar147 * dVar147) *
                    0.9847450218426964 * -0.375;
        }
        dVar72 = -0.0;
        if (dVar21 < dVar100) {
          dVar21 = 0.0;
          if (bVar8 && bVar7) {
            dVar21 = dVar158 - (dVar23 + dVar23);
          }
          dVar72 = (dVar21 * dVar175 + dVar134 * 0.4444444444444444 * dVar99 * dVar99) *
                   0.9847450218426964 * -0.375;
        }
        dVar100 = dVar78 * dVar78;
        dVar34 = 1.0 / dVar34;
        auVar122._8_8_ = dVar148;
        auVar122._0_8_ = dVar34;
        auVar70._0_8_ = __x_00 * dVar100;
        auVar70._8_8_ = dVar140;
        auVar120 = divpd(auVar122,auVar70);
        dVar60 = dVar60 * dVar239;
        dVar21 = dVar222 / (dVar128 * auVar69._0_8_);
        dVar61 = dVar61 * dVar232;
        dVar62 = dVar62 * dVar109;
        dVar63 = dVar63 * dVar110;
        dVar64 = dVar64 * dVar233;
        dVar65 = dVar65 * dVar238;
        dVar217 = dVar217 * dVar22;
        dVar66 = dVar66 * dVar189;
        dVar204 = dVar204 * 1.4422495703074083;
        dVar67 = dVar67 * dVar87;
        dVar99 = auVar120._8_8_ * dVar73 * dVar157;
        local_e08 = auVar120._0_8_;
        if ((uVar4 & 4) != 0 && pdVar5 != (double *)0x0) {
          dVar87 = dVar123 * dVar123;
          dVar189 = dVar87 * dVar194 * local_e08;
          dVar125 = dVar87 * dVar97 * local_e08;
          dVar22 = dVar123 * dVar97 * dVar156;
          dVar181 = dVar87 * dVar227 * local_e08;
          dVar109 = dVar123 * dVar227 * dVar156;
          dVar140 = dVar87 * dVar195 * local_e08;
          dVar110 = dVar123 * dVar172 * dVar156;
          dVar128 = dVar123 * dVar194 * dVar156;
          dVar23 = dVar123 * dVar229 * dVar156;
          dVar239 = dVar87 * dVar229 * local_e08;
          dVar232 = dVar123 * local_9e8 * dVar156;
          dVar238 = dVar87 * dVar244 * local_e08;
          dVar32 = dVar87 * dVar172 * local_e08;
          dVar196 = dVar87 * local_9e8 * local_e08;
          dVar200 = dVar123 * dVar222 * dVar156;
          dVar114 = dVar87 * dVar222 * local_e08;
          dVar88 = dVar123 * dVar198 * dVar156;
          dVar153 = dVar87 * dVar198 * local_e08;
          dVar233 = dVar123 * dVar195 * dVar156;
          lVar11 = (long)(p->dim).v2rho2 * sVar13;
          pdVar5[lVar11 + 2] =
               ((double)(~uVar19 &
                        (ulong)((dVar125 * dVar98 * 155.55555555555554 +
                                 dVar114 * dVar235 * 272.22222222222223 +
                                 dVar62 * 116.66666666666667 * dVar153 +
                                 dVar114 * dVar150 * 116.66666666666667 +
                                 dVar153 * dVar53 * 200.0 +
                                 dVar61 * 83.33333333333333 * dVar140 +
                                 dVar153 * dVar178 * 83.33333333333333 +
                                 local_e08 * dVar39 * 366.6666666666667 * dVar87 * dVar21 +
                                 dVar237 * 672.2222222222222 * dVar238 +
                                 dVar60 * 305.55555555555554 * dVar239 +
                                 dVar156 * dVar124 * dVar51 * -8.88888888888889 +
                                 dVar111 * -35.55555555555556 * dVar22 +
                                 dVar188 * -4.444444444444445 * dVar156 * dVar124 +
                                 dVar63 * 155.55555555555554 * dVar114 +
                                 dVar200 * dVar98 * -31.11111111111111 +
                                 dVar88 * dVar235 * -31.11111111111111 +
                                 dVar150 * -26.666666666666668 * dVar88 +
                                 dVar233 * dVar53 * -26.666666666666668 +
                                 dVar233 * dVar178 * -22.22222222222222 +
                                 dVar240 * -22.22222222222222 * dVar109 +
                                 dVar109 * dVar173 * -17.77777777777778 +
                                 dVar232 * dVar52 * -17.77777777777778 +
                                 dVar37 * -13.333333333333334 * dVar232 +
                                 dVar87 * dVar2 * 5.555555555555555 * dVar231 * local_e08 +
                                 dVar243 * dVar123 * dVar1 * -4.444444444444445 * dVar156 +
                                 dVar87 * dVar1 * 5.555555555555555 * dVar231 * local_e08 +
                                 dVar224 * -35.55555555555556 * dVar200 +
                                 dVar52 * 88.88888888888889 * dVar181 +
                                 dVar196 * dVar217 * 33.333333333333336 +
                                 dVar37 * 33.333333333333336 * dVar181 +
                                 dVar228 * 50.0 * dVar196 +
                                 dVar32 * dVar65 * 16.666666666666668 +
                                 dVar36 * 16.666666666666668 * dVar196 +
                                 dVar51 * 22.22222222222222 * dVar32 +
                                 dVar188 * 5.555555555555555 * dVar32 +
                                 dVar239 * dVar38 * 250.0 +
                                 dVar242 * 450.0 * dVar189 +
                                 dVar64 * 200.0 * dVar125 +
                                 dVar224 * 355.55555555555554 * dVar125 + dVar111 * 200.0 * dVar189
                                + dVar238 * dVar166 * 305.55555555555554 +
                                  dVar54 * 555.5555555555555 * dVar239 +
                                  dVar189 * dVar67 * 250.0 +
                                  dVar39 * -48.888888888888886 * dVar123 * dVar244 * dVar156 +
                                  dVar23 * dVar237 * -48.888888888888886 +
                                  dVar166 * -44.44444444444444 * dVar23 +
                                  dVar128 * dVar54 * -44.44444444444444 +
                                  dVar38 * -40.0 * dVar128 +
                                  dVar22 * dVar242 * -40.0 +
                                  dVar110 * dVar228 * -13.333333333333334 +
                                  dVar36 * -8.88888888888889 * dVar110 +
                                  dVar140 * dVar240 * 138.88888888888889 +
                                  dVar173 * 55.55555555555556 * dVar140 +
                                  dVar66 * 55.55555555555556 * dVar181) * dVar169 * dVar73 * dVar41
                               + dVar91 * -0.25 +
                                 dVar42 * 0.0026912690725894063 +
                                 dVar180 + dVar205 * -0.75 * dVar131 +
                                           dVar155 * dVar204 * 0.008073807217768219 * dVar176 +
                                           dVar72 * dVar151 + dVar50 * dVar205 * -0.25 +
                                 local_1010 * local_1010 * (dVar34 / (dVar100 * dVar116)) * dVar112
                                 * dVar40 * dVar99 * 0.00019692461905715026 +
                                 dVar168 * (dVar79 / dVar100) * local_1010 * dVar40 *
                                 dVar115 * -0.014801979899241736 +
                                 dVar130 * dVar154 * dVar115 * 0.008073807217768219)) +
               (double)(~uVar18 & (ulong)(dVar142 + dVar101 * dVar86 + dVar132 * -0.25))) * __x +
               dVar174 + dVar174 + local_798 + local_798 + pdVar5[lVar11 + 2];
        }
        dVar125 = dVar129 * dVar203 * 0.0005046129511105137 * dVar145;
        dVar72 = 0.0;
        if (dVar68 < dVar20) {
          dVar72 = dVar144 * dVar218 * dVar93 +
                   dVar92 * 0.0040369036088841095 *
                   dVar182 * dVar167 * dVar24 * 1.8171205928321397 * dVar85 +
                   dVar225 * -7.384673214643134e-05 *
                   local_fc0 * (dVar26 / (dVar75 * dVar159)) * dVar112 * dVar85 +
                   (dVar43 * dVar73 * -0.0015138388533315413 * dVar145 - dVar125);
        }
        pdVar5 = out->v2rhosigma;
        if ((uVar4 & 4) != 0 && pdVar5 != (double *)0x0) {
          lVar11 = (long)(p->dim).v2rhosigma * sVar13;
          pdVar5[lVar11] = dVar72 * __x + dVar117 + pdVar5[lVar11];
          lVar11 = (long)(p->dim).v2rhosigma * sVar13;
          pdVar5[lVar11 + 1] = pdVar5[lVar11 + 1] + 0.0;
        }
        dVar22 = dVar157 * dVar203 * 0.0005046129511105137 * dVar56;
        dVar72 = 0.0;
        if (dVar68 < __x_00) {
          dVar72 = dVar139 * dVar73 * -0.0015138388533315413 * dVar56 - dVar22;
        }
        if ((uVar4 & 4) != 0 && pdVar5 != (double *)0x0) {
          lVar11 = (long)(p->dim).v2rhosigma * sVar13;
          pdVar5[lVar11 + 2] = dVar72 * __x + dVar57 + pdVar5[lVar11 + 2];
        }
        dVar72 = 0.0;
        if (dVar68 < dVar20) {
          dVar72 = dVar190 * dVar73 * -0.0015138388533315413 * dVar145 - dVar125;
        }
        if ((uVar4 & 4) != 0 && pdVar5 != (double *)0x0) {
          lVar11 = (long)(p->dim).v2rhosigma * sVar13;
          pdVar5[lVar11 + 3] = dVar72 * __x + dVar117 + pdVar5[lVar11 + 3];
          lVar11 = (long)(p->dim).v2rhosigma * sVar13;
          pdVar5[lVar11 + 4] = pdVar5[lVar11 + 4] + 0.0;
        }
        dVar72 = 0.0;
        if (dVar68 < __x_00) {
          dVar72 = dVar154 * dVar55 * dVar95 +
                   dVar94 * 0.0040369036088841095 *
                   dVar167 * dVar156 * dVar148 * 1.8171205928321397 * dVar40 +
                   dVar99 * -7.384673214643134e-05 *
                   dVar112 * (dVar34 / (dVar78 * dVar100)) * dVar40 * local_1010 +
                   (dVar204 * dVar73 * -0.0015138388533315413 * dVar56 - dVar22);
        }
        if ((uVar4 & 4) != 0 && pdVar5 != (double *)0x0) {
          lVar11 = (long)(p->dim).v2rhosigma * sVar13;
          pdVar5[lVar11 + 5] = dVar72 * __x + dVar57 + pdVar5[lVar11 + 5];
        }
        pdVar5 = out->v2rholapl;
        if ((uVar10 & 0x8004) == 0 && pdVar5 != (double *)0x0) {
          lVar11 = (long)(p->dim).v2rholapl * sVar13;
          pdVar5[lVar11] = pdVar5[lVar11] + 0.0;
          lVar11 = (long)(p->dim).v2rholapl * sVar13;
          pdVar5[lVar11 + 1] = pdVar5[lVar11 + 1] + 0.0;
          lVar11 = (long)(p->dim).v2rholapl * sVar13;
          pdVar5[lVar11 + 2] = pdVar5[lVar11 + 2] + 0.0;
          lVar11 = (long)(p->dim).v2rholapl * sVar13;
          pdVar5[lVar11 + 3] = pdVar5[lVar11 + 3] + 0.0;
        }
        dVar99 = dVar77 * dVar141 * dVar133 * dVar203 * 0.125;
        dVar72 = 0.0;
        if (dVar68 < dVar20) {
          dVar159 = dVar26 / dVar159;
          dVar125 = dVar159 * dVar186 * dVar163;
          dVar75 = dVar159 * dVar126 * dVar163;
          dVar22 = dVar159 * local_af8 * dVar163;
          dVar101 = dVar159 * dVar193 * dVar163;
          dVar72 = dVar159 * dVar76 * dVar163;
          dVar23 = dVar159 * dVar103 * dVar163;
          dVar129 = dVar159 * dVar27 * dVar163;
          dVar139 = dVar159 * dVar234 * dVar163;
          dVar20 = dVar159 * dVar29 * dVar163;
          dVar77 = dVar159 * dVar30 * dVar163;
          dVar72 = (dVar143 * -163.33333333333334 * dVar125 +
                    dVar149 * -70.0 * dVar75 +
                    dVar159 * dVar187 * dVar104 * -220.0 * dVar163 +
                    dVar127 * -50.0 * dVar75 +
                    dVar47 * -83.33333333333333 * dVar22 +
                    dVar77 * dVar221 * -33.333333333333336 +
                    dVar106 * -33.333333333333336 * dVar22 +
                    dVar46 * -53.333333333333336 * dVar77 +
                    dVar20 * dVar230 * -20.0 +
                    dVar84 * -20.0 * dVar77 +
                    dVar45 * -30.0 * dVar20 +
                    dVar74 * -10.0 * dVar72 +
                    dVar223 * -13.333333333333334 * dVar72 + dVar105 * -10.0 * dVar20 +
                   dVar139 * dVar49 * -403.3333333333333 +
                   dVar129 * dVar170 * -183.33333333333334 +
                   dVar82 * -183.33333333333334 * dVar139 +
                   dVar44 * -333.3333333333333 * dVar129 +
                   dVar23 * dVar197 * -150.0 +
                   dVar171 * -150.0 * dVar129 +
                   dVar199 * -270.0 * dVar23 +
                   dVar101 * dVar165 * -120.0 +
                   dVar202 * -120.0 * dVar23 +
                   dVar71 * -213.33333333333334 * dVar101 +
                   dVar107 * -93.33333333333333 * dVar125 +
                   dVar83 * -3.3333333333333335 * dVar72 + dVar138 * -93.33333333333333 * dVar101 +
                   dVar84 * 5.0 * dVar29 * dVar81 +
                   dVar45 * 5.0 * dVar76 * dVar81 +
                   dVar76 * dVar81 * dVar105 * 3.3333333333333335 +
                   dVar49 * 18.333333333333332 * dVar27 * dVar81 +
                   dVar82 * 16.666666666666668 * dVar27 * dVar81 +
                   dVar44 * 16.666666666666668 * dVar103 * dVar81 +
                   dVar171 * 15.0 * dVar103 * dVar81 +
                   dVar199 * 15.0 * dVar193 * dVar81 +
                   dVar202 * 13.333333333333334 * dVar193 * dVar81 +
                   dVar71 * 13.333333333333334 * dVar81 * dVar186 +
                   dVar138 * 11.666666666666666 * dVar81 * dVar186 +
                   dVar104 * 18.333333333333332 * dVar234 * dVar81 +
                   dVar143 * 11.666666666666666 * dVar81 * dVar126 +
                   dVar125 * dVar108 * -70.0 +
                   dVar75 * dVar48 * -120.0 +
                   dVar216 * -50.0 * dVar22 +
                   dVar28 * dVar1 * 1.6666666666666667 * dVar81 +
                   local_aa8 * dVar163 * dVar2 * -3.3333333333333335 * dVar159 +
                   dVar113 * dVar159 * dVar1 * -3.3333333333333335 +
                   dVar223 * 3.3333333333333335 * local_aa8 * dVar81 +
                   dVar83 * 1.6666666666666667 * local_aa8 * dVar81 +
                   dVar108 * 10.0 * dVar81 * dVar126 +
                   dVar48 * 10.0 * dVar81 * local_af8 +
                   dVar127 * 8.333333333333334 * dVar81 * local_af8 +
                   dVar81 * dVar30 * dVar47 * 8.333333333333334 +
                   dVar46 * 6.666666666666667 * dVar29 * dVar81 +
                   dVar106 * 6.666666666666667 * dVar81 * dVar30) * dVar141 * dVar73 * dVar31 +
                   dVar219 * 0.0040369036088841095 * dVar90 * dVar133 +
                   (dVar152 * -0.375 * dVar102 - dVar99);
        }
        pdVar5 = out->v2rhotau;
        if ((uVar10 & 0x10004) == 0 && pdVar5 != (double *)0x0) {
          lVar11 = (long)(p->dim).v2rhotau * sVar13;
          pdVar5[lVar11] = dVar72 * __x + dVar118 + pdVar5[lVar11];
        }
        dVar20 = dVar33 * dVar169 * dVar80 * dVar203 * -0.125;
        if ((uVar10 & 0x10004) == 0 && pdVar5 != (double *)0x0) {
          lVar11 = (long)(p->dim).v2rhotau * sVar13;
          pdVar5[lVar11 + 1] =
               (double)(~uVar19 & (ulong)(dVar184 * dVar58 + dVar20)) * __x + dVar59 +
               pdVar5[lVar11 + 1];
        }
        if ((uVar10 & 0x10004) == 0 && pdVar5 != (double *)0x0) {
          lVar11 = (long)(p->dim).v2rhotau * sVar13;
          pdVar5[lVar11 + 2] =
               (double)(~uVar18 & (ulong)(dVar201 * dVar102 - dVar99)) * __x + dVar118 +
               pdVar5[lVar11 + 2];
        }
        dVar72 = 0.0;
        if (dVar68 < __x_00) {
          dVar100 = dVar34 / dVar100;
          dVar72 = dVar100 * dVar244 * dVar123;
          dVar23 = dVar195 * dVar100 * dVar123;
          dVar68 = dVar100 * dVar227 * dVar123;
          dVar99 = dVar100 * dVar198 * dVar123;
          dVar77 = dVar222 * dVar100 * dVar123;
          dVar125 = dVar100 * dVar97 * dVar123;
          dVar139 = dVar100 * dVar194 * dVar123;
          dVar22 = dVar100 * dVar172 * dVar123;
          dVar75 = dVar100 * local_9e8 * dVar123;
          dVar28 = dVar229 * dVar100 * dVar123;
          dVar72 = (dVar28 * dVar60 * -183.33333333333334 +
                    dVar166 * -183.33333333333334 * dVar72 +
                    dVar54 * -333.3333333333333 * dVar28 +
                    dVar67 * -150.0 * dVar139 +
                    dVar38 * -150.0 * dVar28 +
                    dVar242 * -270.0 * dVar139 +
                    dVar64 * -120.0 * dVar125 +
                    dVar52 * -53.333333333333336 * dVar68 +
                    dVar75 * dVar217 * -20.0 +
                    dVar37 * -20.0 * dVar68 +
                    dVar228 * -30.0 * dVar75 +
                    dVar65 * -10.0 * dVar22 +
                    dVar51 * -13.333333333333334 * dVar22 + dVar36 * -10.0 * dVar75 +
                   dVar188 * -3.3333333333333335 * dVar22 +
                   dVar111 * -120.0 * dVar139 +
                   dVar224 * -213.33333333333334 * dVar125 +
                   dVar77 * dVar63 * -93.33333333333333 +
                   dVar98 * -93.33333333333333 * dVar125 +
                   dVar235 * -163.33333333333334 * dVar77 +
                   dVar99 * dVar62 * -70.0 +
                   dVar150 * -70.0 * dVar77 +
                   dVar53 * -120.0 * dVar99 +
                   dVar61 * -50.0 * dVar23 +
                   dVar178 * -50.0 * dVar99 +
                   dVar66 * -33.333333333333336 * dVar68 + dVar240 * -83.33333333333333 * dVar23 +
                   dVar173 * -33.333333333333336 * dVar23 +
                   dVar100 * dVar21 * dVar39 * -220.0 * dVar123 +
                   dVar237 * -403.3333333333333 * dVar72 +
                   dVar1 * 1.6666666666666667 * dVar35 * dVar243 +
                   dVar1 * dVar100 * -3.3333333333333335 * dVar124 +
                   dVar123 * dVar2 * -3.3333333333333335 * dVar100 * dVar231 +
                   dVar52 * 6.666666666666667 * dVar35 * local_9e8 +
                   dVar37 * 5.0 * dVar35 * local_9e8 +
                   dVar228 * 5.0 * dVar35 * dVar172 +
                   dVar36 * 3.3333333333333335 * dVar35 * dVar172 +
                   dVar51 * 3.3333333333333335 * dVar35 * dVar231 +
                   dVar188 * 1.6666666666666667 * dVar35 * dVar231 +
                   dVar224 * 13.333333333333334 * dVar35 * dVar222 +
                   dVar111 * 13.333333333333334 * dVar35 * dVar97 +
                   dVar98 * 11.666666666666666 * dVar35 * dVar222 +
                   dVar235 * 11.666666666666666 * dVar35 * dVar198 +
                   dVar150 * 10.0 * dVar35 * dVar198 +
                   dVar53 * 10.0 * dVar35 * dVar195 +
                   dVar178 * 8.333333333333334 * dVar35 * dVar195 +
                   dVar240 * 8.333333333333334 * dVar35 * dVar227 +
                   dVar173 * 6.666666666666667 * dVar35 * dVar227 +
                   dVar39 * 18.333333333333332 * dVar244 * dVar35 +
                   dVar237 * 18.333333333333332 * dVar35 * dVar229 +
                   dVar166 * 16.666666666666668 * dVar35 * dVar229 +
                   dVar54 * 16.666666666666668 * dVar35 * dVar194 +
                   dVar242 * 15.0 * dVar35 * dVar97 + dVar38 * 15.0 * dVar35 * dVar194) * dVar169 *
                   dVar73 * dVar41 +
                   dVar115 * 0.0040369036088841095 * dVar130 * dVar80 +
                   dVar205 * -0.375 * dVar58 + dVar20;
        }
        if ((uVar10 & 0x10004) == 0 && pdVar5 != (double *)0x0) {
          lVar11 = (long)(p->dim).v2rhotau * sVar13;
          pdVar5[lVar11 + 3] = dVar72 * __x + dVar59 + pdVar5[lVar11 + 3];
        }
        pdVar5 = out->v2sigma2;
        if ((uVar4 & 4) != 0 && pdVar5 != (double *)0x0) {
          lVar11 = (long)(p->dim).v2sigma2 * sVar13;
          pdVar5[lVar11] =
               (double)(~uVar18 &
                       (ulong)(dVar135 * dVar25 * (dVar24 / dVar179) * 3.3019272488946267 * dVar85 *
                              dVar92 * 2.7692524554911753e-05)) * __x + pdVar5[lVar11];
          lVar11 = (long)(p->dim).v2sigma2 * sVar13;
          pdVar5[lVar11 + 1] = pdVar5[lVar11 + 1] + 0.0;
          lVar11 = (long)(p->dim).v2sigma2 * sVar13;
          pdVar5[lVar11 + 2] = pdVar5[lVar11 + 2] + 0.0;
          lVar11 = (long)(p->dim).v2sigma2 * sVar13;
          pdVar5[lVar11 + 3] = pdVar5[lVar11 + 3] + 0.0;
          lVar11 = (long)(p->dim).v2sigma2 * sVar13;
          pdVar5[lVar11 + 4] = pdVar5[lVar11 + 4] + 0.0;
        }
        if ((uVar4 & 4) != 0 && pdVar5 != (double *)0x0) {
          lVar11 = (long)(p->dim).v2sigma2 * sVar13;
          pdVar5[lVar11 + 5] =
               (double)(~uVar19 &
                       (ulong)(auVar120._8_8_ * 3.3019272488946267 * dVar25 * local_e08 * dVar40 *
                              dVar94 * 2.7692524554911753e-05)) * __x + pdVar5[lVar11 + 5];
        }
        pdVar5 = out->v2sigmalapl;
        if ((uVar10 & 0x8004) == 0 && pdVar5 != (double *)0x0) {
          lVar11 = (long)(p->dim).v2sigmalapl * sVar13;
          pdVar5[lVar11] = pdVar5[lVar11] + 0.0;
          lVar11 = (long)(p->dim).v2sigmalapl * sVar13;
          pdVar5[lVar11 + 1] = pdVar5[lVar11 + 1] + 0.0;
          lVar11 = (long)(p->dim).v2sigmalapl * sVar13;
          pdVar5[lVar11 + 2] = pdVar5[lVar11 + 2] + 0.0;
          lVar11 = (long)(p->dim).v2sigmalapl * sVar13;
          pdVar5[lVar11 + 3] = pdVar5[lVar11 + 3] + 0.0;
          lVar11 = (long)(p->dim).v2sigmalapl * sVar13;
          pdVar5[lVar11 + 4] = pdVar5[lVar11 + 4] + 0.0;
          lVar11 = (long)(p->dim).v2sigmalapl * sVar13;
          pdVar5[lVar11 + 5] = pdVar5[lVar11 + 5] + 0.0;
        }
        pdVar5 = out->v2sigmatau;
        if ((uVar10 & 0x10004) == 0 && pdVar5 != (double *)0x0) {
          lVar11 = (long)(p->dim).v2sigmatau * sVar13;
          pdVar5[lVar11] =
               (double)(~uVar18 & (ulong)(dVar93 * dVar218 * dVar133)) * __x + pdVar5[lVar11];
          lVar11 = (long)(p->dim).v2sigmatau * sVar13;
          pdVar5[lVar11 + 1] = pdVar5[lVar11 + 1] + 0.0;
          lVar11 = (long)(p->dim).v2sigmatau * sVar13;
          pdVar5[lVar11 + 2] = pdVar5[lVar11 + 2] + 0.0;
          lVar11 = (long)(p->dim).v2sigmatau * sVar13;
          pdVar5[lVar11 + 3] = pdVar5[lVar11 + 3] + 0.0;
          lVar11 = (long)(p->dim).v2sigmatau * sVar13;
          pdVar5[lVar11 + 4] = pdVar5[lVar11 + 4] + 0.0;
        }
        if ((uVar10 & 0x10004) == 0 && pdVar5 != (double *)0x0) {
          lVar11 = (long)(p->dim).v2sigmatau * sVar13;
          pdVar5[lVar11 + 5] =
               (double)(~uVar19 & (ulong)(dVar95 * dVar55 * dVar80)) * __x + pdVar5[lVar11 + 5];
        }
        pdVar5 = out->v2lapl2;
        if ((uVar10 & 0x8004) == 0 && pdVar5 != (double *)0x0) {
          lVar11 = (long)(p->dim).v2lapl2 * sVar13;
          pdVar5[lVar11] = pdVar5[lVar11] + 0.0;
          lVar11 = (long)(p->dim).v2lapl2 * sVar13;
          pdVar5[lVar11 + 1] = pdVar5[lVar11 + 1] + 0.0;
          lVar11 = (long)(p->dim).v2lapl2 * sVar13;
          pdVar5[lVar11 + 2] = pdVar5[lVar11 + 2] + 0.0;
        }
        pdVar5 = out->v2lapltau;
        if ((uVar10 & 0x18004) == 0 && pdVar5 != (double *)0x0) {
          lVar11 = (long)(p->dim).v2lapltau * sVar13;
          pdVar5[lVar11] = pdVar5[lVar11] + 0.0;
          lVar11 = (long)(p->dim).v2lapltau * sVar13;
          pdVar5[lVar11 + 1] = pdVar5[lVar11 + 1] + 0.0;
          lVar11 = (long)(p->dim).v2lapltau * sVar13;
          pdVar5[lVar11 + 2] = pdVar5[lVar11 + 2] + 0.0;
          lVar11 = (long)(p->dim).v2lapltau * sVar13;
          pdVar5[lVar11 + 3] = pdVar5[lVar11 + 3] + 0.0;
        }
        pdVar5 = out->v2tau2;
        if ((uVar10 & 0x10004) == 0 && pdVar5 != (double *)0x0) {
          dVar26 = dVar26 / dVar89;
          local_af8 = dVar26 * local_af8;
          dVar76 = dVar76 * dVar26;
          dVar29 = dVar29 * dVar26;
          dVar30 = dVar30 * dVar26;
          dVar126 = dVar126 * dVar26;
          dVar186 = dVar186 * dVar26;
          dVar27 = dVar27 * dVar26;
          dVar103 = dVar103 * dVar26;
          dVar193 = dVar193 * dVar26;
          lVar11 = (long)(p->dim).v2tau2 * sVar13;
          pdVar5[lVar11] =
               (double)(~uVar18 &
                       (ulong)(dVar31 * dVar141 * (dVar234 * dVar26 * dVar49 * 242.0 +
                                                   dVar27 * dVar170 * 110.0 +
                                                   dVar44 * 200.0 * dVar27 +
                                                   dVar103 * dVar202 * 72.0 +
                                                   dVar197 * 90.0 * dVar103 +
                                                   dVar199 * 162.0 * dVar103 +
                                                   dVar193 * dVar138 * 56.0 +
                                                   dVar165 * 72.0 * dVar193 +
                                                   dVar71 * 128.0 * dVar193 +
                                                   dVar107 * 56.0 * dVar186 +
                                                   dVar74 * 6.0 * dVar76 +
                                                   dVar82 * 110.0 * dVar234 * dVar26 +
                                                   dVar171 * 90.0 * dVar27 +
                                                   dVar26 * (dVar2 + dVar2) * local_aa8 +
                                                   dVar26 * (dVar1 + dVar1) * local_aa8 +
                                                   dVar187 * dVar104 * 132.0 * dVar26 +
                                                  dVar108 * 42.0 * dVar186 +
                                                  dVar143 * 98.0 * dVar186 +
                                                  dVar126 * dVar149 * 42.0 +
                                                  dVar127 * 30.0 * dVar126 +
                                                  dVar48 * 72.0 * dVar126 +
                                                  local_af8 * dVar216 * 30.0 +
                                                  dVar106 * 20.0 * local_af8 +
                                                  dVar47 * 50.0 * local_af8 +
                                                  dVar30 * dVar221 * 20.0 +
                                                  dVar84 * 12.0 * dVar30 +
                                                  dVar46 * 32.0 * dVar30 +
                                                  dVar29 * dVar230 * 12.0 +
                                                  dVar105 * 6.0 * dVar29 +
                                                  dVar45 * 18.0 * dVar29 +
                                                  dVar223 * 8.0 * dVar76 +
                                                  (dVar83 + dVar83) * dVar76) * dVar73)) * __x +
               pdVar5[lVar11];
          lVar11 = (long)(p->dim).v2tau2 * sVar13;
          pdVar5[lVar11 + 1] = pdVar5[lVar11 + 1] + 0.0;
        }
        if ((uVar10 & 0x10004) == 0 && pdVar5 != (double *)0x0) {
          dVar34 = dVar34 / dVar116;
          dVar172 = dVar172 * dVar34;
          dVar198 = dVar198 * dVar34;
          dVar194 = dVar194 * dVar34;
          dVar195 = dVar195 * dVar34;
          dVar227 = dVar227 * dVar34;
          dVar229 = dVar229 * dVar34;
          dVar97 = dVar97 * dVar34;
          dVar20 = auVar215._8_8_ * dVar34;
          dVar222 = dVar222 * dVar34;
          lVar11 = (long)(p->dim).v2tau2 * sVar13;
          pdVar5[lVar11 + 2] =
               __x * (double)(~uVar19 &
                             (ulong)(dVar41 * dVar73 * dVar169 * (dVar244 * dVar34 * dVar237 * 242.0
                                                                  + dVar166 * 110.0 *
                                                                    dVar244 * dVar34 +
                                                                    dVar198 * dVar178 * 30.0 +
                                                                    dVar195 * dVar240 * 50.0 +
                                                                    dVar227 * dVar52 * 32.0 +
                                                                    dVar172 * dVar51 * 8.0 +
                                                                    dVar229 * dVar54 * 200.0 +
                                                                    dVar38 * 90.0 * dVar229 +
                                                                    dVar195 * dVar173 * 20.0 +
                                                                    dVar227 * dVar37 * 12.0 +
                                                                    dVar36 * 6.0 * dVar20 +
                                                                    (dVar188 + dVar188) * dVar172 +
                                                                    (dVar2 + dVar2) * dVar34 *
                                                                    dVar231 + dVar21 * dVar39 * 
                                                  132.0 * dVar34 +
                                                  (dVar1 + dVar1) * dVar34 * dVar231 +
                                                  dVar228 * 18.0 * dVar20 +
                                                  dVar222 * dVar235 * 98.0 +
                                                  dVar150 * 42.0 * dVar222 +
                                                  dVar198 * dVar53 * 72.0 +
                                                  dVar194 * dVar242 * 162.0 +
                                                  dVar194 * dVar111 * 72.0 +
                                                  dVar97 * dVar98 * 56.0 +
                                                  dVar194 * dVar67 * 90.0 +
                                                  dVar66 * 20.0 * dVar227 +
                                                  dVar20 * dVar217 * 12.0 +
                                                  dVar172 * dVar65 * 6.0 +
                                                  dVar64 * 72.0 * dVar97 +
                                                  dVar63 * 56.0 * dVar222 +
                                                  dVar62 * 42.0 * dVar198 +
                                                  dVar229 * dVar60 * 110.0 + dVar195 * dVar61 * 30.0
                                                  + dVar224 * 128.0 * dVar97))) + pdVar5[lVar11 + 2]
          ;
        }
      }
      sVar13 = sVar13 + 1;
    } while (np != sVar13);
  }
  return;
}

Assistant:

static void
WORK_MGGA(ORDER_TXT, SPIN_TXT)
(const XC(func_type) *p, size_t np,
 const double *rho, const double *sigma, const double *lapl, const double *tau,
 xc_mgga_out_params *out)
{

#ifdef XC_DEBUG
  /* This throws an exception when floating point errors are encountered */
  //feenableexcept(FE_DIVBYZERO | FE_INVALID | FE_OVERFLOW);
#endif

  size_t ip;
  double dens;
  double my_rho[2]={0.0, 0.0};
  double my_sigma[3]={0.0, 0.0, 0.0};
  double my_tau[2]={0.0, 0.0};

  for(ip = 0; ip < np; ip++){
    /* Screen low density */
    dens = (p->nspin == XC_POLARIZED) ? VAR(rho, ip, 0) + VAR(rho, ip, 1) : VAR(rho, ip, 0);
    if(dens < p->dens_threshold)
      continue;

    /* sanity check of input parameters */
    my_rho[0] = m_max(p->dens_threshold, VAR(rho, ip, 0));
    my_sigma[0] = m_max(p->sigma_threshold * p->sigma_threshold, VAR(sigma, ip, 0));

    /* Many functionals shamelessly divide by tau, so we set a reasonable threshold */
    /* skip all checks on tau for the kinetic functionals */
    if(p->info->flags & XC_FLAGS_NEEDS_TAU){
      my_tau[0] = m_max(p->tau_threshold, VAR(tau, ip, 0));
      if(p->info->flags & XC_FLAGS_ENFORCE_FHC) {
        /* The Fermi hole curvature 1 - xs^2/(8*ts) must be positive */
        my_sigma[0] = m_min(my_sigma[0], 8.0*my_rho[0]*my_tau[0]);
      }
    }
    /* lapl can have any values */

    if(p->nspin == XC_POLARIZED){
      double s_ave;

      my_rho[1] = m_max(p->dens_threshold, VAR(rho, ip, 1));
      my_sigma[2] = m_max(p->sigma_threshold * p->sigma_threshold, VAR(sigma, ip, 2));

      if(p->info->flags & XC_FLAGS_NEEDS_TAU){
        my_tau[1] = m_max(p->tau_threshold, VAR(tau, ip, 1));
        if(p->info->flags & XC_FLAGS_ENFORCE_FHC) {
          /* The Fermi hole curvature 1 - xs^2/(8*ts) must be positive */
          my_sigma[2] = m_min(my_sigma[2], 8.0*my_rho[1]*my_tau[1]);
        }
      }
      
      my_sigma[1] = VAR(sigma, ip, 1);
      s_ave = 0.5*(my_sigma[0] + my_sigma[2]);
      /* | grad n |^2 = |grad n_up + grad n_down|^2 > 0 */
      my_sigma[1] = (my_sigma[1] >= -s_ave ? my_sigma[1] : -s_ave);
      /* Since |grad n_up - grad n_down|^2 > 0 we also have */
      my_sigma[1] = (my_sigma[1] <= +s_ave ? my_sigma[1] : +s_ave);
    }

    FUNC(ORDER_TXT, SPIN_TXT)(p, ip, my_rho, my_sigma, &VAR(lapl, ip, 0), my_tau, out);

    /* check for NaNs */
#ifdef XC_DEBUG
    {
      const xc_dimensions *dim = &(p->dim);
      int ii, is_OK = 1;

      if(out->zk != NULL)
        is_OK = is_OK & isfinite(out->VAR(zk, ip, 0));

      if(out->vrho != NULL){
        for(ii=0; ii < dim->vrho; ii++)
          is_OK = is_OK && isfinite(out->VAR(vrho, ip, ii));
        for(ii=0; ii < dim->vsigma; ii++)
          is_OK = is_OK && isfinite(out->VAR(vsigma, ip, ii));
        if(p->info->flags & XC_FLAGS_NEEDS_LAPLACIAN)
          for(ii=0; ii < dim->vlapl; ii++)
            is_OK = is_OK && isfinite(out->VAR(vlapl, ip, ii));
        if(p->info->flags & XC_FLAGS_NEEDS_TAU)
          for(ii=0; ii < dim->vtau; ii++)
            is_OK = is_OK && isfinite(out->VAR(vtau, ip, ii));
      }

      if(!is_OK){
        printf("Problem in the evaluation of the functional\n");
        if(p->nspin == XC_UNPOLARIZED){
          printf("./xc-get_data %d 1 ", p->info->number);
          if(p->info->flags & (XC_FLAGS_NEEDS_LAPLACIAN | XC_FLAGS_NEEDS_TAU))
            printf("%le 0.0 %le 0.0 0.0 %le 0.0 %le 0.0\n",
                   VAR(rho, ip, 0), VAR(sigma, ip, 0), VAR(lapl, ip, 0), VAR(tau, ip, 0));
          else if(p->info->flags & XC_FLAGS_NEEDS_LAPLACIAN)
            printf("%le 0.0 %le 0.0 0.0 %le 0.0 0.0 0.0\n",
                   VAR(rho, ip, 0), VAR(sigma, ip, 0), VAR(lapl, ip, 0));
          else
            printf("%le 0.0 %le 0.0 0.0 0.0 0.0 %le 0.0\n",
                   VAR(rho, ip, 0), VAR(sigma, ip, 0), VAR(tau, ip, 0));
        }else{
          printf("./xc-get_data %d 2 ", p->info->number);
          if(p->info->flags & (XC_FLAGS_NEEDS_LAPLACIAN | XC_FLAGS_NEEDS_TAU))
            printf("%le %le %le %le %le %le %le %le %le\n",
                   VAR(rho, ip, 0), VAR(rho, ip, 1),
                   VAR(sigma, ip, 0), VAR(sigma, ip, 1), VAR(sigma, ip, 2),
                   VAR(lapl, ip, 0), VAR(lapl, ip, 1),
                   VAR(tau, ip, 0), VAR(tau, ip, 1));
          else if(p->info->flags & XC_FLAGS_NEEDS_LAPLACIAN)
            printf("%le %le %le %le %le %le %le 0.0 0.0\n",
                   VAR(rho, ip, 0), VAR(rho, ip, 1),
                   VAR(sigma, ip, 0), VAR(sigma, ip, 1), VAR(sigma, ip, 2),
                   VAR(lapl, ip, 0), VAR(lapl, ip, 1));
          else
            printf("%le %le %le %le %le 0.0 0.0 %le %le\n",
                   VAR(rho, ip, 0), VAR(rho, ip, 1),
                   VAR(sigma, ip, 0), VAR(sigma, ip, 1), VAR(sigma, ip, 2),
                   VAR(tau, ip, 0), VAR(tau, ip, 1));
        }
      }
    }
#endif
  }   /* for(ip) */

}